

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O2

int Ifd_ManDsdTest4(void)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  int i;
  int pPerm [6];
  
  pPerm[0] = 0;
  pPerm[1] = 1;
  pPerm[2] = 2;
  pPerm[3] = 3;
  pPerm[4] = 4;
  pPerm[5] = 5;
  p = Ifd_ManDsdPermJT(6);
  iVar2 = p->nSize;
  for (i = 0; i < iVar2; i = i + 1) {
    iVar3 = Vec_IntEntry(p,i);
    puVar1 = (ulong *)(pPerm + iVar3);
    *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
    Ifd_ManDsdPermPrint(pPerm,6);
  }
  Vec_IntFree(p);
  return 1;
}

Assistant:

int Ifd_ManDsdTest4() 
{
    int pPerm[6] = { 0, 1, 2, 3, 4, 5 };
    Vec_Int_t * vGuide = Ifd_ManDsdPermJT( 6 );
    int i, Entry;
    Vec_IntForEachEntry( vGuide, Entry, i )
    {
        ABC_SWAP( int, pPerm[Entry], pPerm[Entry+1] );
        Ifd_ManDsdPermPrint( pPerm, 6 );
    }
    Vec_IntFree( vGuide );
    return 1;
}